

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void open_func(LexState *ls,FuncState *fs,BlockCnt *bl)

{
  Proto *o;
  Proto *f;
  BlockCnt *bl_local;
  FuncState *fs_local;
  LexState *ls_local;
  
  o = fs->f;
  fs->prev = ls->fs;
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->previousline = o->linedefined;
  fs->iwthabs = '\0';
  fs->lasttarget = 0;
  fs->freereg = '\0';
  fs->nk = 0;
  fs->nabslineinfo = 0;
  fs->np = 0;
  fs->nups = '\0';
  fs->ndebugvars = 0;
  fs->nactvar = '\0';
  fs->needclose = '\0';
  fs->firstlocal = (ls->dyd->actvar).n;
  fs->firstlabel = (ls->dyd->label).n;
  fs->bl = (BlockCnt *)0x0;
  o->source = ls->source;
  if (((o->marked & 0x20) != 0) && ((o->source->marked & 0x18) != 0)) {
    luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)o->source);
  }
  o->maxstacksize = '\x02';
  enterblock(fs,bl,'\0');
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs, BlockCnt *bl) {
  Proto *f = fs->f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->previousline = f->linedefined;
  fs->iwthabs = 0;
  fs->lasttarget = 0;
  fs->freereg = 0;
  fs->nk = 0;
  fs->nabslineinfo = 0;
  fs->np = 0;
  fs->nups = 0;
  fs->ndebugvars = 0;
  fs->nactvar = 0;
  fs->needclose = 0;
  fs->firstlocal = ls->dyd->actvar.n;
  fs->firstlabel = ls->dyd->label.n;
  fs->bl = NULL;
  f->source = ls->source;
  luaC_objbarrier(ls->L, f, f->source);
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  enterblock(fs, bl, 0);
}